

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu-quants.c
# Opt level: O0

void quantize_row_q8_0(float *x,void *vy,int64_t k)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined1 auVar10 [32];
  undefined1 auVar11 [24];
  undefined1 auVar12 [24];
  undefined1 auVar13 [24];
  undefined1 auVar14 [24];
  undefined1 (*pauVar15) [32];
  undefined1 (*pauVar16) [32];
  undefined1 (*pauVar17) [32];
  long lVar18;
  long in_RDX;
  long in_RSI;
  undefined1 (*in_RDI) [32];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  __m256i perm;
  __m256i i3;
  __m256i i2;
  __m256i i1;
  __m256i i0;
  __m256 mul;
  float id;
  float d;
  float maxScalar;
  __m128 max4;
  __m256 maxAbs;
  __m256 signBit;
  __m256 v3;
  __m256 v2;
  __m256 v1;
  __m256 v0;
  int i;
  block_q8_0 *y;
  int nb;
  float local_888;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 uStack_7f0;
  undefined8 uStack_7e8;
  undefined1 local_740 [8];
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  undefined4 uStack_724;
  undefined1 local_720 [8];
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  undefined4 uStack_704;
  undefined1 local_700 [8];
  float fStack_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  undefined4 uStack_6e4;
  undefined1 local_6e0 [8];
  float fStack_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  float fStack_6c8;
  undefined4 uStack_6c4;
  int local_6b4;
  undefined1 (*local_690) [32];
  float local_3f0;
  float local_3c0;
  float fStack_3bc;
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  undefined4 uStack_3a4;
  float local_380;
  float fStack_37c;
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  undefined4 uStack_364;
  float local_340;
  float fStack_33c;
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  undefined4 uStack_324;
  float local_320;
  float fStack_31c;
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float local_300;
  float fStack_2fc;
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  undefined4 uStack_2e4;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  
  local_690 = in_RDI;
  for (local_6b4 = 0; local_6b4 < (int)(in_RDX / 0x20); local_6b4 = local_6b4 + 1) {
    auVar11 = *(undefined1 (*) [24])*local_690;
    uVar6 = *(undefined8 *)(*local_690 + 0x18);
    auVar5 = *local_690;
    pauVar15 = local_690 + 1;
    auVar12 = *(undefined1 (*) [24])*pauVar15;
    uVar7 = *(undefined8 *)(local_690[1] + 0x18);
    pauVar16 = local_690 + 2;
    auVar13 = *(undefined1 (*) [24])*pauVar16;
    uVar8 = *(undefined8 *)(local_690[2] + 0x18);
    pauVar17 = local_690 + 3;
    auVar14 = *(undefined1 (*) [24])*pauVar17;
    uVar9 = *(undefined8 *)(local_690[3] + 0x18);
    local_690 = local_690 + 4;
    auVar19 = vinsertps_avx(ZEXT416(0x80000000),ZEXT416(0x80000000),0x10);
    auVar19 = vinsertps_avx(auVar19,ZEXT416(0x80000000),0x20);
    auVar19 = vinsertps_avx(auVar19,ZEXT416(0x80000000),0x30);
    auVar1 = vinsertps_avx(ZEXT416(0x80000000),ZEXT416(0x80000000),0x10);
    auVar1 = vinsertps_avx(auVar1,ZEXT416(0x80000000),0x20);
    auVar1 = vinsertps_avx(auVar1,ZEXT416(0x80000000),0x30);
    uStack_b0 = auVar1._0_8_;
    uStack_a8 = auVar1._8_8_;
    auVar4._16_8_ = uStack_b0;
    auVar4._0_16_ = auVar19;
    auVar4._24_8_ = uStack_a8;
    auVar4 = vpandn_avx2(auVar4,auVar5);
    auVar3._16_8_ = uStack_b0;
    auVar3._0_16_ = auVar19;
    auVar3._24_8_ = uStack_a8;
    auVar5 = vpandn_avx2(auVar3,*pauVar15);
    auVar4 = vmaxps_avx(auVar4,auVar5);
    auVar2._16_8_ = uStack_b0;
    auVar2._0_16_ = auVar19;
    auVar2._24_8_ = uStack_a8;
    auVar5 = vpandn_avx2(auVar2,*pauVar16);
    auVar4 = vmaxps_avx(auVar4,auVar5);
    auVar5._16_8_ = uStack_b0;
    auVar5._0_16_ = auVar19;
    auVar5._24_8_ = uStack_a8;
    auVar5 = vpandn_avx2(auVar5,*pauVar17);
    auVar4 = vmaxps_avx(auVar4,auVar5);
    auVar19 = vmaxps_avx(auVar4._16_16_,auVar4._0_16_);
    auVar1 = vunpckhpd_avx(auVar19,auVar19);
    auVar19 = vmaxps_avx(auVar19,auVar1);
    auVar1 = vmovshdup_avx(auVar19);
    auVar19 = vmaxss_avx(auVar19,auVar1);
    local_3f0 = auVar19._0_4_;
    auVar19 = vcvtps2ph_f16c(ZEXT416((uint)(local_3f0 / 127.0)),0);
    *(short *)(in_RSI + (long)local_6b4 * 0x22) = auVar19._0_2_;
    if ((local_3f0 != 0.0) || (NAN(local_3f0))) {
      local_888 = 127.0 / local_3f0;
    }
    else {
      local_888 = 0.0;
    }
    auVar19 = vinsertps_avx(ZEXT416((uint)local_888),ZEXT416((uint)local_888),0x10);
    auVar19 = vinsertps_avx(auVar19,ZEXT416((uint)local_888),0x20);
    auVar19 = vinsertps_avx(auVar19,ZEXT416((uint)local_888),0x30);
    auVar1 = vinsertps_avx(ZEXT416((uint)local_888),ZEXT416((uint)local_888),0x10);
    auVar1 = vinsertps_avx(auVar1,ZEXT416((uint)local_888),0x20);
    auVar1 = vinsertps_avx(auVar1,ZEXT416((uint)local_888),0x30);
    local_300 = auVar11._0_4_;
    fStack_2fc = auVar11._4_4_;
    fStack_2f8 = auVar11._8_4_;
    fStack_2f4 = auVar11._12_4_;
    fStack_2f0 = auVar11._16_4_;
    fStack_2ec = auVar11._20_4_;
    fStack_2e8 = (float)uVar6;
    uStack_2e4 = (undefined4)((ulong)uVar6 >> 0x20);
    local_320 = auVar19._0_4_;
    fStack_31c = auVar19._4_4_;
    fStack_318 = auVar19._8_4_;
    fStack_314 = auVar19._12_4_;
    fStack_310 = auVar1._0_4_;
    fStack_30c = auVar1._4_4_;
    fStack_308 = auVar1._8_4_;
    local_6e0._4_4_ = fStack_2fc * fStack_31c;
    local_6e0._0_4_ = local_300 * local_320;
    fStack_6d8 = fStack_2f8 * fStack_318;
    fStack_6d4 = fStack_2f4 * fStack_314;
    fStack_6d0 = fStack_2f0 * fStack_310;
    fStack_6cc = fStack_2ec * fStack_30c;
    fStack_6c8 = fStack_2e8 * fStack_308;
    uStack_6c4 = uStack_2e4;
    local_340 = auVar12._0_4_;
    fStack_33c = auVar12._4_4_;
    fStack_338 = auVar12._8_4_;
    fStack_334 = auVar12._12_4_;
    fStack_330 = auVar12._16_4_;
    fStack_32c = auVar12._20_4_;
    fStack_328 = (float)uVar7;
    uStack_324 = (undefined4)((ulong)uVar7 >> 0x20);
    local_700._4_4_ = fStack_33c * fStack_31c;
    local_700._0_4_ = local_340 * local_320;
    fStack_6f8 = fStack_338 * fStack_318;
    fStack_6f4 = fStack_334 * fStack_314;
    fStack_6f0 = fStack_330 * fStack_310;
    fStack_6ec = fStack_32c * fStack_30c;
    fStack_6e8 = fStack_328 * fStack_308;
    uStack_6e4 = uStack_324;
    local_380 = auVar13._0_4_;
    fStack_37c = auVar13._4_4_;
    fStack_378 = auVar13._8_4_;
    fStack_374 = auVar13._12_4_;
    fStack_370 = auVar13._16_4_;
    fStack_36c = auVar13._20_4_;
    fStack_368 = (float)uVar8;
    uStack_364 = (undefined4)((ulong)uVar8 >> 0x20);
    local_720._4_4_ = fStack_37c * fStack_31c;
    local_720._0_4_ = local_380 * local_320;
    fStack_718 = fStack_378 * fStack_318;
    fStack_714 = fStack_374 * fStack_314;
    fStack_710 = fStack_370 * fStack_310;
    fStack_70c = fStack_36c * fStack_30c;
    fStack_708 = fStack_368 * fStack_308;
    uStack_704 = uStack_364;
    local_3c0 = auVar14._0_4_;
    fStack_3bc = auVar14._4_4_;
    fStack_3b8 = auVar14._8_4_;
    fStack_3b4 = auVar14._12_4_;
    fStack_3b0 = auVar14._16_4_;
    fStack_3ac = auVar14._20_4_;
    fStack_3a8 = (float)uVar9;
    uStack_3a4 = (undefined4)((ulong)uVar9 >> 0x20);
    local_740._4_4_ = fStack_3bc * fStack_31c;
    local_740._0_4_ = local_3c0 * local_320;
    fStack_738 = fStack_3b8 * fStack_318;
    fStack_734 = fStack_3b4 * fStack_314;
    fStack_730 = fStack_3b0 * fStack_310;
    fStack_72c = fStack_3ac * fStack_30c;
    fStack_728 = fStack_3a8 * fStack_308;
    uStack_724 = uStack_3a4;
    auVar4 = vroundps_avx(_local_6e0,0);
    auVar5 = vroundps_avx(_local_700,0);
    auVar2 = vroundps_avx(_local_720,0);
    auVar3 = vroundps_avx(_local_740,0);
    auVar4 = vcvtps2dq_avx(auVar4);
    auVar5 = vcvtps2dq_avx(auVar5);
    auVar2 = vcvtps2dq_avx(auVar2);
    auVar3 = vcvtps2dq_avx(auVar3);
    auVar4 = vpackssdw_avx2(auVar4,auVar5);
    auVar5 = vpackssdw_avx2(auVar2,auVar3);
    auVar4 = vpacksswb_avx2(auVar4,auVar5);
    auVar19 = vpinsrd_avx(ZEXT416(2),6,1);
    auVar19 = vpinsrd_avx(auVar19,3,2);
    auVar19 = vpinsrd_avx(auVar19,7,3);
    auVar1 = vpinsrd_avx(ZEXT416(0),4,1);
    auVar1 = vpinsrd_avx(auVar1,1,2);
    auVar1 = vpinsrd_avx(auVar1,5,3);
    auVar20 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar19;
    uStack_f0 = auVar20._0_8_;
    uStack_e8 = auVar20._8_8_;
    auVar10._16_8_ = uStack_f0;
    auVar10._0_16_ = ZEXT116(0) * auVar19 + ZEXT116(1) * auVar1;
    auVar10._24_8_ = uStack_e8;
    auVar4 = vpermd_avx2(auVar10,auVar4);
    lVar18 = in_RSI + (long)local_6b4 * 0x22;
    local_800 = auVar4._0_8_;
    uStack_7f8 = auVar4._8_8_;
    uStack_7f0 = auVar4._16_8_;
    uStack_7e8 = auVar4._24_8_;
    *(undefined8 *)(lVar18 + 2) = local_800;
    *(undefined8 *)(lVar18 + 10) = uStack_7f8;
    *(undefined8 *)(lVar18 + 0x12) = uStack_7f0;
    *(undefined8 *)(lVar18 + 0x1a) = uStack_7e8;
  }
  return;
}

Assistant:

void quantize_row_q8_0(const float * GGML_RESTRICT x, void * GGML_RESTRICT vy, int64_t k) {
    assert(QK8_0 == 32);
    assert(k % QK8_0 == 0);
    const int nb = k / QK8_0;

    block_q8_0 * GGML_RESTRICT y = vy;

#if defined(__ARM_NEON)
    for (int i = 0; i < nb; i++) {
        float32x4_t srcv [8];
        float32x4_t asrcv[8];
        float32x4_t amaxv[8];

        for (int j = 0; j < 8; j++) srcv[j]  = vld1q_f32(x + i*32 + 4*j);
        for (int j = 0; j < 8; j++) asrcv[j] = vabsq_f32(srcv[j]);

        for (int j = 0; j < 4; j++) amaxv[2*j] = vmaxq_f32(asrcv[2*j], asrcv[2*j+1]);
        for (int j = 0; j < 2; j++) amaxv[4*j] = vmaxq_f32(amaxv[4*j], amaxv[4*j+2]);
        for (int j = 0; j < 1; j++) amaxv[8*j] = vmaxq_f32(amaxv[8*j], amaxv[8*j+4]);

        const float amax = vmaxvq_f32(amaxv[0]);

        const float d = amax / ((1 << 7) - 1);
        const float id = d ? 1.0f/d : 0.0f;

        y[i].d = GGML_FP32_TO_FP16(d);

        for (int j = 0; j < 8; j++) {
            const float32x4_t v  = vmulq_n_f32(srcv[j], id);
            const int32x4_t   vi = vcvtnq_s32_f32(v);

            y[i].qs[4*j + 0] = vgetq_lane_s32(vi, 0);
            y[i].qs[4*j + 1] = vgetq_lane_s32(vi, 1);
            y[i].qs[4*j + 2] = vgetq_lane_s32(vi, 2);
            y[i].qs[4*j + 3] = vgetq_lane_s32(vi, 3);
        }
    }
#elif defined __wasm_simd128__
    for (int i = 0; i < nb; i++) {
        v128_t srcv [8];
        v128_t asrcv[8];
        v128_t amaxv[8];

        for (int j = 0; j < 8; j++) srcv[j]  = wasm_v128_load(x + i*32 + 4*j);
        for (int j = 0; j < 8; j++) asrcv[j] = wasm_f32x4_abs(srcv[j]);

        for (int j = 0; j < 4; j++) amaxv[2*j] = wasm_f32x4_max(asrcv[2*j], asrcv[2*j+1]);
        for (int j = 0; j < 2; j++) amaxv[4*j] = wasm_f32x4_max(amaxv[4*j], amaxv[4*j+2]);
        for (int j = 0; j < 1; j++) amaxv[8*j] = wasm_f32x4_max(amaxv[8*j], amaxv[8*j+4]);

        const float amax = MAX(MAX(wasm_f32x4_extract_lane(amaxv[0], 0),
                                   wasm_f32x4_extract_lane(amaxv[0], 1)),
                               MAX(wasm_f32x4_extract_lane(amaxv[0], 2),
                                   wasm_f32x4_extract_lane(amaxv[0], 3)));

        const float d = amax / ((1 << 7) - 1);
        const float id = d ? 1.0f/d : 0.0f;

        y[i].d = GGML_FP32_TO_FP16(d);

        for (int j = 0; j < 8; j++) {
            const v128_t v  = wasm_f32x4_mul(srcv[j], wasm_f32x4_splat(id));
            const v128_t vi = wasm_i32x4_trunc_sat_f32x4(v);

            y[i].qs[4*j + 0] = wasm_i32x4_extract_lane(vi, 0);
            y[i].qs[4*j + 1] = wasm_i32x4_extract_lane(vi, 1);
            y[i].qs[4*j + 2] = wasm_i32x4_extract_lane(vi, 2);
            y[i].qs[4*j + 3] = wasm_i32x4_extract_lane(vi, 3);
        }
    }
#elif defined(__AVX2__) || defined(__AVX__)
    for (int i = 0; i < nb; i++) {
        // Load elements into 4 AVX vectors
        __m256 v0 = _mm256_loadu_ps( x );
        __m256 v1 = _mm256_loadu_ps( x + 8 );
        __m256 v2 = _mm256_loadu_ps( x + 16 );
        __m256 v3 = _mm256_loadu_ps( x + 24 );
        x += 32;

        // Compute max(abs(e)) for the block
        const __m256 signBit = _mm256_set1_ps( -0.0f );
        __m256 maxAbs = _mm256_andnot_ps( signBit, v0 );
        maxAbs = _mm256_max_ps( maxAbs, _mm256_andnot_ps( signBit, v1 ) );
        maxAbs = _mm256_max_ps( maxAbs, _mm256_andnot_ps( signBit, v2 ) );
        maxAbs = _mm256_max_ps( maxAbs, _mm256_andnot_ps( signBit, v3 ) );

        __m128 max4 = _mm_max_ps( _mm256_extractf128_ps( maxAbs, 1 ), _mm256_castps256_ps128( maxAbs ) );
        max4 = _mm_max_ps( max4, _mm_movehl_ps( max4, max4 ) );
        max4 = _mm_max_ss( max4, _mm_movehdup_ps( max4 ) );
        const float maxScalar = _mm_cvtss_f32( max4 );

        // Quantize these floats
        const float d = maxScalar / 127.f;
        y[i].d = GGML_FP32_TO_FP16(d);
        const float id = ( maxScalar != 0.0f ) ? 127.f / maxScalar : 0.0f;
        const __m256 mul = _mm256_set1_ps( id );

        // Apply the multiplier
        v0 = _mm256_mul_ps( v0, mul );
        v1 = _mm256_mul_ps( v1, mul );
        v2 = _mm256_mul_ps( v2, mul );
        v3 = _mm256_mul_ps( v3, mul );

        // Round to nearest integer
        v0 = _mm256_round_ps( v0, _MM_ROUND_NEAREST );
        v1 = _mm256_round_ps( v1, _MM_ROUND_NEAREST );
        v2 = _mm256_round_ps( v2, _MM_ROUND_NEAREST );
        v3 = _mm256_round_ps( v3, _MM_ROUND_NEAREST );

        // Convert floats to integers
        __m256i i0 = _mm256_cvtps_epi32( v0 );
        __m256i i1 = _mm256_cvtps_epi32( v1 );
        __m256i i2 = _mm256_cvtps_epi32( v2 );
        __m256i i3 = _mm256_cvtps_epi32( v3 );

#if defined(__AVX2__)
        // Convert int32 to int16
        i0 = _mm256_packs_epi32( i0, i1 );	// 0, 1, 2, 3,  8, 9, 10, 11,  4, 5, 6, 7, 12, 13, 14, 15
        i2 = _mm256_packs_epi32( i2, i3 );	// 16, 17, 18, 19,  24, 25, 26, 27,  20, 21, 22, 23, 28, 29, 30, 31
                                            // Convert int16 to int8
        i0 = _mm256_packs_epi16( i0, i2 );	// 0, 1, 2, 3,  8, 9, 10, 11,  16, 17, 18, 19,  24, 25, 26, 27,  4, 5, 6, 7, 12, 13, 14, 15, 20, 21, 22, 23, 28, 29, 30, 31

        // We got our precious signed bytes, but the order is now wrong
        // These AVX2 pack instructions process 16-byte pieces independently
        // The following instruction is fixing the order
        const __m256i perm = _mm256_setr_epi32( 0, 4, 1, 5, 2, 6, 3, 7 );
        i0 = _mm256_permutevar8x32_epi32( i0, perm );

        _mm256_storeu_si256((__m256i *)y[i].qs, i0);
#else
        // Since we don't have in AVX some necessary functions,
        // we split the registers in half and call AVX2 analogs from SSE
        __m128i ni0 = _mm256_castsi256_si128( i0 );
        __m128i ni1 = _mm256_extractf128_si256( i0, 1);
        __m128i ni2 = _mm256_castsi256_si128( i1 );
        __m128i ni3 = _mm256_extractf128_si256( i1, 1);
        __m128i ni4 = _mm256_castsi256_si128( i2 );
        __m128i ni5 = _mm256_extractf128_si256( i2, 1);
        __m128i ni6 = _mm256_castsi256_si128( i3 );
        __m128i ni7 = _mm256_extractf128_si256( i3, 1);

        // Convert int32 to int16
        ni0 = _mm_packs_epi32( ni0, ni1 );
        ni2 = _mm_packs_epi32( ni2, ni3 );
        ni4 = _mm_packs_epi32( ni4, ni5 );
        ni6 = _mm_packs_epi32( ni6, ni7 );
        // Convert int16 to int8
        ni0 = _mm_packs_epi16( ni0, ni2 );
        ni4 = _mm_packs_epi16( ni4, ni6 );

        _mm_storeu_si128((__m128i *)(y[i].qs +  0), ni0);
        _mm_storeu_si128((__m128i *)(y[i].qs + 16), ni4);
#endif
    }
#elif defined(__riscv_v_intrinsic)

    size_t vl = QK8_0;

    for (int i = 0; i < nb; i++) {
        // load elements
        vfloat32m8_t v_x   = __riscv_vle32_v_f32m8(x+i*QK8_0, vl);

        vfloat32m8_t vfabs = __riscv_vfabs_v_f32m8(v_x, vl);
        vfloat32m1_t tmp   = __riscv_vfmv_v_f_f32m1(0.0f, vl);
        vfloat32m1_t vmax  = __riscv_vfredmax_vs_f32m8_f32m1(vfabs, tmp, vl);
        float amax = __riscv_vfmv_f_s_f32m1_f32(vmax);

        const float d = amax / ((1 << 7) - 1);
        const float id = d ? 1.0f/d : 0.0f;

        y[i].d = GGML_FP32_TO_FP16(d);

        vfloat32m8_t x0 = __riscv_vfmul_vf_f32m8(v_x, id, vl);

        // convert to integer
        vint16m4_t   vi = __riscv_vfncvt_x_f_w_i16m4(x0, vl);
        vint8m2_t    vs = __riscv_vncvt_x_x_w_i8m2(vi, vl);

        // store result
        __riscv_vse8_v_i8m2(y[i].qs , vs, vl);
    }

#elif defined(__POWER9_VECTOR__)
    for (int i = 0; i < nb; i++) {
        vector float srcv [8];
        vector float asrcv[8];
        vector float amaxv[8];
        vector signed int vi[8];

        for (int j = 0; j < 8; j++) srcv[j]  = vec_xl(0, x + i*32 + 4*j);
        for (int j = 0; j < 8; j++) asrcv[j] = vec_abs(srcv[j]);

        for (int j = 0; j < 4; j++) amaxv[2*j] = vec_max(asrcv[2*j], asrcv[2*j+1]);
        for (int j = 0; j < 2; j++) amaxv[4*j] = vec_max(amaxv[4*j], amaxv[4*j+2]);
        for (int j = 0; j < 1; j++) amaxv[8*j] = vec_max(amaxv[8*j], amaxv[8*j+4]);

        const float amax = MAX(MAX(vec_extract(amaxv[0], 0),
                                   vec_extract(amaxv[0], 1)),
                               MAX(vec_extract(amaxv[0], 2),
                                   vec_extract(amaxv[0], 3)));

        const float d = amax / ((1 << 7) - 1);
        const float id = d ? 1.0f/d : 0.0f;
        const vector float vid = vec_splats(id);

        y[i].d = GGML_FP32_TO_FP16(d);

        for (int j = 0; j < 8; j++) {
            const vector float v  = vec_round(vec_mul(srcv[j], vid));
            vi[j] = vec_cts(v, 0);
        }
        vec_xst(vec_pack(vec_pack(vi[0], vi[1]), vec_pack(vi[2], vi[3])),  0, &y[i].qs[0]);
        vec_xst(vec_pack(vec_pack(vi[4], vi[5]), vec_pack(vi[6], vi[7])), 16, &y[i].qs[0]);
    }

#elif defined(__loongarch_asx)
    for (int i = 0; i < nb; i++) {
        __m256 v0 = (__m256)__lasx_xvld( x , 0);
        __m256 v1 = (__m256)__lasx_xvld( x , 32);
        __m256 v2 = (__m256)__lasx_xvld( x , 64);
        __m256 v3 = (__m256)__lasx_xvld( x , 96);
        x += 32;

        // Compute max(abs(e)) for the block
        const __m256 sign_bit = __lasx_xvreplfr2vr_s( -0.0f );
        __m256 max_abs = (__m256)__lasx_xvandn_v( (__m256i)sign_bit, (__m256i)v0 );
        max_abs = __lasx_xvfmax_s( max_abs, (__m256)__lasx_xvandn_v( (__m256i)sign_bit, (__m256i)v1 ) );
        max_abs = __lasx_xvfmax_s( max_abs, (__m256)__lasx_xvandn_v( (__m256i)sign_bit, (__m256i)v2 ) );
        max_abs = __lasx_xvfmax_s( max_abs, (__m256)__lasx_xvandn_v( (__m256i)sign_bit, (__m256i)v3 ) );

        __m128 max4 = __lsx_vfmax_s( lasx_extractf128( max_abs, 1 ), lasx_extractf128( max_abs , 0) );
        max4 = __lsx_vfmax_s( max4, (__m128)__lsx_vpickod_d((__m128i) max4, (__m128i)max4 ) );
        __m128 tmp = max4;
        max4 = __lsx_vfmax_s( max4, (__m128)__lsx_vinsgr2vr_w(tmp, __lsx_vpickve2gr_w( max4, 1 ), 0 ));
        const float max_scalar = ((v4f32)max4)[0];

        // Quantize these floats
        const float d = max_scalar / 127.f;
        y[i].d = GGML_FP32_TO_FP16(d);
        const float id = ( max_scalar != 0.0f ) ? 127.f / max_scalar : 0.0f;
        const __m256 mul = (__m256)__lasx_xvreplfr2vr_s( id );

        // Apply the multiplier
        v0 = __lasx_xvfmul_s( v0, mul );
        v1 = __lasx_xvfmul_s( v1, mul );
        v2 = __lasx_xvfmul_s( v2, mul );
        v3 = __lasx_xvfmul_s( v3, mul );

        // Round to nearest integer
        __m256i i0 = __lasx_xvftintrne_w_s( v0 );
        __m256i i1 = __lasx_xvftintrne_w_s( v1 );
        __m256i i2 = __lasx_xvftintrne_w_s( v2 );
        __m256i i3 = __lasx_xvftintrne_w_s( v3 );

        __m128i ni0 = lasx_extracti128( i0, 0 );
        __m128i ni1 = lasx_extracti128( i0, 1);
        __m128i ni2 = lasx_extracti128( i1, 0);
        __m128i ni3 = lasx_extracti128( i1, 1);
        __m128i ni4 = lasx_extracti128( i2, 0);
        __m128i ni5 = lasx_extracti128( i2, 1);
        __m128i ni6 = lasx_extracti128( i3, 0);
        __m128i ni7 = lasx_extracti128( i3, 1);

        // Convert int32 to int16
        ni0 = lsx_packs_w( ni0, ni1 );
        ni2 = lsx_packs_w( ni2, ni3 );
        ni4 = lsx_packs_w( ni4, ni5 );
        ni6 = lsx_packs_w( ni6, ni7 );
        // Convert int16 to int8
        ni0 = lsx_packs_h( ni0, ni2 );
        ni4 = lsx_packs_h( ni4, ni6 );

        __lsx_vst(ni0, (__m128i *)(y[i].qs +  0), 0);
        __lsx_vst(ni4, (__m128i *)(y[i].qs + 16), 0);

    }
#elif defined(__VXE__) || defined(__VXE2__)
    for (int i = 0; i < nb; i++) {
        __vector float srcv [8];
        __vector float asrcv[8];
        __vector float amaxv[8];

        for (int j = 0; j < 8; j++) srcv[j] = vec_xl(0, x + i*32 + 4*j);
        for (int j = 0; j < 8; j++) asrcv[j] = vec_abs(srcv[j]);
        for (int j = 0; j < 4; j++) amaxv[2*j] = vec_max(asrcv[2*j], asrcv[2*j+1]);
        for (int j = 0; j < 2; j++) amaxv[4*j] = vec_max(amaxv[4*j], amaxv[4*j+2]);
        for (int j = 0; j < 1; j++) amaxv[8*j] = vec_max(amaxv[8*j], amaxv[8*j+4]);

        const float amax = MAX(MAX(vec_extract(amaxv[0], 0),
                                   vec_extract(amaxv[0], 1)),
                               MAX(vec_extract(amaxv[0], 2),
                                   vec_extract(amaxv[0], 3)));

        const float d = amax / ((1 << 7) - 1);
        const float id = d ? 1.0f / d : 0.0f;

        y[i].d = GGML_FP32_TO_FP16(d);

        for (int j = 0; j < 8; j++) {
            const __vector float v = vec_mul(srcv[j], vec_splats(id));
            const __vector int32_t vi = vec_signed(v);

            y[i].qs[4*j + 0] = vec_extract(vi, 0);
            y[i].qs[4*j + 1] = vec_extract(vi, 1);
            y[i].qs[4*j + 2] = vec_extract(vi, 2);
            y[i].qs[4*j + 3] = vec_extract(vi, 3);
        }
    }
#else
    GGML_UNUSED(nb);
    // scalar
    quantize_row_q8_0_ref(x, y, k);
#endif
}